

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall sznet::net::Connector::handleWrite(Connector *this)

{
  bool bVar1;
  sz_sock sockfd;
  int v;
  self *psVar2;
  LogStream *this_00;
  char *str;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  Logger local_1028;
  undefined1 local_58 [12];
  undefined1 local_48 [12];
  undefined1 local_38 [12];
  
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_58,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_58._0_8_;
    file.m_size = local_58._8_4_;
    Logger::Logger(&local_1028,file,0xa2,TRACE,"handleWrite");
    psVar2 = LogStream::operator<<(&local_1028.m_impl.m_stream,"Connector::handleWrite ");
    LogStream::operator<<(psVar2,this->m_state);
    Logger::~Logger(&local_1028);
  }
  if (this->m_state != kDisconnected) {
    if (this->m_state != kConnecting) {
      __assert_fail("m_state == kDisconnected",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                    ,0xc6,"void sznet::net::Connector::handleWrite()");
    }
    sockfd = removeAndResetChannel(this);
    v = sockets::sz_sock_geterror(sockfd);
    if (v == 0) {
      bVar1 = sockets::sz_sock_isselfconnect(sockfd);
      if (!bVar1) {
        this->m_state = kConnected;
        if (this->m_connect == true) {
          std::function<void_(int)>::operator()(&this->m_newConnectionCallback,sockfd);
          return;
        }
        sockets::sz_closesocket(sockfd);
        return;
      }
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_38,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file_01._12_4_ = 0;
      file_01.m_data = (char *)local_38._0_8_;
      file_01.m_size = local_38._8_4_;
      Logger::Logger(&local_1028,file_01,0xb2,WARN);
      LogStream::operator<<(&local_1028.m_impl.m_stream,"Connector::handleWrite - Self connect");
    }
    else {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_48,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_48._0_8_;
      file_00.m_size = local_48._8_4_;
      Logger::Logger(&local_1028,file_00,0xaa,WARN);
      psVar2 = LogStream::operator<<
                         (&local_1028.m_impl.m_stream,"Connector::handleWrite - SO_ERROR = ");
      this_00 = LogStream::operator<<(psVar2,v);
      psVar2 = LogStream::operator<<(this_00," ");
      str = sz_strerror_tl(v);
      LogStream::operator<<(psVar2,str);
    }
    Logger::~Logger(&local_1028);
    retry(this,sockfd);
  }
  return;
}

Assistant:

void Connector::handleWrite()
{
	LOG_TRACE << "Connector::handleWrite " << m_state;

	if (m_state == kConnecting)
	{
		sockets::sz_sock sockfd = removeAndResetChannel();
		int err = sockets::sz_sock_geterror(sockfd);
		if (err)
		{
			LOG_WARN << "Connector::handleWrite - SO_ERROR = "
				<< err << " " << sz_strerror_tl(err);
			retry(sockfd);
		}
		else if (sockets::sz_sock_isselfconnect(sockfd))
		{
			// ���������ӣ���(source IP, source port) = (destination IP, destination port)
			// ������ʽ���ǳ�����������
			LOG_WARN << "Connector::handleWrite - Self connect";
			retry(sockfd);
		}
		else
		{
			// ���ӳɹ�
			setState(kConnected);
			if (m_connect)
			{
				m_newConnectionCallback(sockfd);
			}
			else
			{
				sockets::sz_closesocket(sockfd);
			}
		}
	}
	else
	{
		// what happened?
		assert(m_state == kDisconnected);
	}
}